

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.cc
# Opt level: O0

t_pvalue __thiscall t_queue::f_pop(t_queue *this)

{
  anon_class_8_1_8991fb9c in_RSI;
  t_pvalue tVar1;
  t_queue *this_local;
  
  tVar1 = xemmai::t_sharable::
          f_owned_or_shared<xemmai::t_lock_with_safe_region,t_queue::f_pop()::__0>
                    (&this->super_t_sharable,in_RSI);
  tVar1.super_t_pointer.v_p = (t_object *)this;
  return tVar1;
}

Assistant:

t_pvalue t_queue::f_pop()
{
	return f_owned_or_shared<t_lock_with_safe_region>([&]
	{
		if (!v_head) f_throw(L"empty queue."sv);
		auto& pair = v_head->f_as<t_pair>().v_next;
		if (pair == v_head)
			v_head = nullptr;
		else
			v_head->f_as<t_pair>().v_next = pair->f_as<t_pair>().v_next;
		return t_pvalue(pair->f_as<t_pair>().v_value);
	});
}